

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O3

MatrixXd * __thiscall
CppCNN::build_labels_matrix(MatrixXd *__return_storage_ptr__,CppCNN *this,VectorXd *train_labels)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  ulong local_38;
  ulong local_30;
  undefined8 local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"build_labels_matrix",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  local_38 = this->__output_size;
  local_30 = (train_labels->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_rows;
  local_28 = 0;
  if ((long)(local_30 | local_38) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_38);
  lVar2 = (train_labels->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if (0 < lVar2) {
    pdVar3 = (train_labels->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_data;
    pdVar5 = (__return_storage_ptr__->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar4 = (__return_storage_ptr__->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    lVar6 = 0;
    do {
      dVar1 = pdVar3[lVar6];
      uVar7 = (ulong)dVar1;
      uVar7 = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
      if ((((long)uVar7 < 0) || (lVar4 <= (long)uVar7)) ||
         ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_cols <= lVar6)) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x16d,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      pdVar5[uVar7] = 1.0;
      lVar6 = lVar6 + 1;
      pdVar5 = pdVar5 + lVar4;
    } while (lVar2 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

MatrixXd CppCNN::build_labels_matrix(const Eigen::VectorXd& train_labels) {
	cout << __FUNCTION__ << endl;

	MatrixXd labels_mat = MatrixXd::Constant(__output_size, train_labels.rows(), 0);
	for (int i = 0; i < train_labels.rows(); i++)
		labels_mat(static_cast<size_t>(train_labels.coeff(i)), i) = 1;

	return labels_mat;
}